

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_sinh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  int8_t roundingPrecision;
  undefined1 auVar2 [12];
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 fVar11;
  floatx80 fVar12;
  floatx80 fVar13;
  floatx80 fVar14;
  
  fVar11.low = a.low;
  uVar8 = a._8_4_;
  uVar5 = (ulong)uVar8;
  if ((~uVar8 & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      auVar2 = a._0_12_;
      a_00._12_4_ = 0;
      a_00.low = auVar2._0_8_;
      a_00.high = auVar2._8_2_;
      a_00._10_2_ = auVar2._10_2_;
      fVar11 = propagateFloatx80NaNOneArg(a_00,status);
      return fVar11;
    }
    uVar5 = (ulong)(ushort)((a.high & 0x8000) + 0x7fff);
  }
  else {
    uVar9 = uVar8 & 0x7fff;
    if (fVar11.low != 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0
       ) {
      uVar10 = (uVar8 & 0xffff) >> 0xf;
      cVar1 = status->float_rounding_mode;
      roundingPrecision = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      uVar3 = (uint)a.low._6_2_ | uVar9 << 0x10;
      if (uVar3 < 0x400cb168) {
        fVar11._8_4_ = uVar9;
        fVar11._12_4_ = 0;
        fVar11 = floatx80_etoxm1_m68k(fVar11,status);
        fVar12 = float32_to_floatx80_m68k(0x3f800000,status);
        fVar13._8_8_ = fVar12._8_8_ & 0xffffffff;
        fVar13.low = fVar12.low;
        auVar2 = fVar11._0_12_;
        a_01._12_4_ = 0;
        a_01.low = auVar2._0_8_;
        a_01.high = auVar2._8_2_;
        a_01._10_2_ = auVar2._10_2_;
        fVar11 = floatx80_add_m68k(a_01,fVar13,status);
        fVar12._8_8_ = fVar11._8_8_ & 0xffffffff;
        fVar12.low = fVar11.low;
        a_02._12_4_ = 0;
        a_02.low = auVar2._0_8_;
        a_02.high = auVar2._8_2_;
        a_02._10_2_ = auVar2._10_2_;
        fVar11 = floatx80_div_m68k(a_02,fVar12,status);
        b._12_4_ = 0;
        b.low = auVar2._0_8_;
        b.high = auVar2._8_2_;
        b._10_2_ = auVar2._10_2_;
        auVar2 = fVar11._0_12_;
        a_03._12_4_ = 0;
        a_03.low = auVar2._0_8_;
        a_03.high = auVar2._8_2_;
        a_03._10_2_ = auVar2._10_2_;
        fVar11 = floatx80_add_m68k(a_03,b,status);
        uVar4 = fVar11.low;
        uVar7 = fVar11._8_4_;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = roundingPrecision;
        fVar11 = float32_to_floatx80_m68k(uVar10 << 0x1f | 0x3f000000,status);
        uVar6 = fVar11.low;
        uVar5 = fVar11._8_8_ & 0xffffffff;
      }
      else {
        if (0x400cb2b3 < uVar3) {
          status->float_rounding_mode = cVar1;
          status->floatx80_rounding_precision = roundingPrecision;
          fVar11 = roundAndPackFloatx80_m68k
                             (roundingPrecision,(flag)uVar10,0x8000,fVar11.low,0,status);
          return fVar11;
        }
        fVar13 = float64_to_floatx80_m68k(0x40c62d38d3d64634,status);
        b_00._8_8_ = fVar13._8_8_ & 0xffffffff;
        b_00.low = fVar13.low;
        a_04._8_4_ = uVar9;
        a_04.low = fVar11.low;
        a_04._12_4_ = 0;
        fVar11 = floatx80_sub_m68k(a_04,b_00,status);
        fVar13 = float64_to_floatx80_m68k(0x3d6f90aeb1e75cc7,status);
        b_01._8_8_ = fVar13._8_8_ & 0xffffffff;
        b_01.low = fVar13.low;
        auVar2 = fVar11._0_12_;
        a_05._12_4_ = 0;
        a_05.low = auVar2._0_8_;
        a_05.high = auVar2._8_2_;
        a_05._10_2_ = auVar2._10_2_;
        fVar11 = floatx80_sub_m68k(a_05,b_01,status);
        auVar2 = fVar11._0_12_;
        a_06._12_4_ = 0;
        a_06.low = auVar2._0_8_;
        a_06.high = auVar2._8_2_;
        a_06._10_2_ = auVar2._10_2_;
        fVar11 = floatx80_etox_m68k(a_06,status);
        uVar4 = fVar11.low;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = roundingPrecision;
        uVar6 = 0x8000000000000000;
        uVar7 = fVar11._8_4_;
        uVar5 = (ulong)(uVar8 & 0xffff8000 | 0x7ffb);
      }
      b_02._8_8_ = uVar5;
      b_02.low = uVar6;
      a_07._8_4_ = uVar7;
      a_07.low = uVar4;
      a_07._12_4_ = 0;
      fVar11 = floatx80_mul_m68k(a_07,b_02,status);
      uVar6 = fVar11.low;
      float_raise_m68k(' ',status);
      uVar5 = (ulong)fVar11._8_4_;
      goto LAB_006f3a3c;
    }
  }
  uVar6 = 0;
LAB_006f3a3c:
  fVar14._8_8_ = uVar5;
  fVar14.low = uVar6;
  return fVar14;
}

Assistant:

floatx80 floatx80_sinh(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1, fp2;
    float32 fact;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return packFloatx80(aSign, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact > 0x400CB167) {
        /* SINHBIG */
        if (compact > 0x400CB2B3) {
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                        aSign, 0x8000, aSig, 0, status);
        } else {
            fp0 = floatx80_abs(a); /* Y = |X| */
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x40C62D38D3D64634), status),
                               status); /* (|X|-16381LOG2_LEAD) */
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x3D6F90AEB1E75CC7), status),
                               status); /* |X| - 16381 LOG2, ACCURATE */
            fp0 = floatx80_etox(fp0, status);
            fp2 = packFloatx80(aSign, 0x7FFB, one_sig);

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_mul(fp0, fp2, status);

            float_raise(float_flag_inexact, status);

            return a;
        }
    } else { /* |X| < 16380 LOG2 */
        fp0 = floatx80_abs(a); /* Y = |X| */
        fp0 = floatx80_etoxm1(fp0, status); /* FP0 IS Z = EXPM1(Y) */
        fp1 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* 1+Z */
        fp2 = fp0;
        fp0 = floatx80_div(fp0, fp1, status); /* Z/(1+Z) */
        fp0 = floatx80_add(fp0, fp2, status);

        fact = packFloat32(aSign, 0x7E, 0);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, float32_to_floatx80(fact, status), status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}